

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

uint util::sleep(uint __seconds)

{
  uint uVar1;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 auVar3 [16];
  timespec ts;
  timespec local_10;
  
  local_10.tv_sec =
       (long)in_XMM0_Qa >> 0x3f & (long)(in_XMM0_Qa - 9.223372036854776e+18) | (long)in_XMM0_Qa;
  auVar3._8_4_ = (int)((ulong)local_10.tv_sec >> 0x20);
  auVar3._0_8_ = local_10.tv_sec;
  auVar3._12_4_ = 0x45300000;
  dVar2 = (in_XMM0_Qa -
          ((auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_10.tv_sec) - 4503599627370496.0))) * 1000000000.0;
  local_10.tv_nsec = (long)dVar2;
  local_10.tv_nsec =
       (long)(dVar2 - 9.223372036854776e+18) & local_10.tv_nsec >> 0x3f | local_10.tv_nsec;
  uVar1 = nanosleep(&local_10,(timespec *)0x0);
  return uVar1;
}

Assistant:

void sleep(double seconds)
{
#ifdef WIN32
	Sleep(int(seconds * 1000.0));
#else // WIN32
	unsigned long sec = seconds;
	unsigned long nsec = (seconds - double(sec)) * 1000000000.0;
	timespec ts = {time_t(sec), long(nsec)};
	nanosleep(&ts, 0);
#endif // WIN32
}